

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.h
# Opt level: O2

cli_arguments_t *
parse_arguments_abi_cxx11_(cli_arguments_t *__return_storage_ptr__,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  positional_arguments_t positional_arguments;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_b0;
  string arg;
  named_arguments_t named_arguments;
  
  positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  named_arguments._M_h._M_buckets = &named_arguments._M_h._M_single_bucket;
  named_arguments._M_h._M_bucket_count = 1;
  named_arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  named_arguments._M_h._M_element_count = 0;
  named_arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  named_arguments._M_h._M_rehash_policy._M_next_resize = 0;
  named_arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar2 = 1;
  do {
    if (argc <= iVar2) {
LAB_0012ff62:
      std::
      pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
      ::
      pair<std::vector<const_char_*,_std::allocator<const_char_*>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_&,_true>
                (__return_storage_ptr__,&positional_arguments,&named_arguments);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&named_arguments._M_h);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&positional_arguments.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&arg,argv[iVar2],(allocator *)&local_b0);
    if ((*arg._M_dataplus._M_p == '-') && (arg._M_dataplus._M_p[1] == '-')) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&arg);
      std::__cxx11::string::operator=((string *)&arg,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar1 = std::operator==(&arg,"help");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_b0,(string *)&arg);
        local_b0.second = "";
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,char_const*>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&named_arguments);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&arg);
        goto LAB_0012ff62;
      }
      bVar1 = std::operator==(&arg,"components");
      if (bVar1) {
LAB_0012feb6:
        std::__cxx11::string::string((string *)&local_b0,(string *)&arg);
        local_b0.second = "true";
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,char_const*>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&named_arguments,&local_b0);
      }
      else {
        bVar1 = std::operator==(&arg,"undirected");
        if (bVar1) goto LAB_0012feb6;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*&,_true>
                  (&local_b0,&arg,argv + (long)iVar2 + 1);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,char*>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&named_arguments,&local_b0);
        iVar2 = iVar2 + 1;
      }
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&positional_arguments,argv + iVar2);
    }
    std::__cxx11::string::~string((string *)&arg);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

const cli_arguments_t parse_arguments(int argc, char** argv) {
	positional_arguments_t positional_arguments;
	named_arguments_t named_arguments;

	for (int i = 1; i < argc; ++i) {
		std::string arg(argv[i]);

		if (arg[0] != '-' || arg[1] != '-') {
			positional_arguments.push_back(argv[i]);
			continue;
		}

		// We have a named argument, check if we should have extra data attached to it
		arg = arg.substr(2);

		// For the help command, there is no additional data, and we can stop parsing
		if (arg == "help") {
			named_arguments.insert(std::make_pair(arg, ""));
			break;
		}

		// Also components and undirected has no data attached to it.
		// TODO: How to make this nicer without a lot of overhead
		if (arg == "components" || arg == "undirected") {
			named_arguments.insert(std::make_pair(arg, "true"));
			continue;
		}

		// We have extra data, so parse it
		named_arguments.insert(std::make_pair(arg, argv[++i]));
	}

	return std::make_pair(positional_arguments, named_arguments);
}